

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool Fossilize::find_layer
               (vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *layers,char *layer)

{
  bool bVar1;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  local_40;
  char **local_38;
  VkLayerProperties *local_30;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  local_28;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  local_20;
  __normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
  itr;
  char *layer_local;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *layers_local;
  
  itr._M_current = (VkLayerProperties *)layer;
  local_28._M_current =
       (VkLayerProperties *)
       std::begin<std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>>(layers);
  local_30 = (VkLayerProperties *)
             std::end<std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>>(layers);
  local_38 = (char **)&itr;
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<VkLayerProperties_const*,std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>>,Fossilize::find_layer(std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>const&,char_const*)::__0>
                       (local_28,(__normal_iterator<const_VkLayerProperties_*,_std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>_>
                                  )local_30,(anon_class_8_1_a839c471_for__M_pred)local_38);
  local_40._M_current =
       (VkLayerProperties *)
       std::end<std::vector<VkLayerProperties,std::allocator<VkLayerProperties>>>(layers);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  return bVar1;
}

Assistant:

static bool find_layer(const vector<VkLayerProperties> &layers, const char *layer)
{
	auto itr = find_if(begin(layers), end(layers), [&](const VkLayerProperties &prop) -> bool {
		return strcmp(layer, prop.layerName) == 0;
	});
	return itr != end(layers);
}